

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void ClipperLib::MinkowskiSum(Path *pattern,Paths *paths,Paths *solution,bool pathIsClosed)

{
  pointer pvVar1;
  pointer pIVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  IntPoint delta;
  Path tmp2;
  Paths tmp;
  Clipper c;
  
  c.m_Maxima.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&c.m_Maxima;
  c._200_8_ = 0;
  c._184_8_ = 0;
  c._192_8_ = 0;
  c._232_8_ = 0;
  c._216_8_ = 0;
  c._224_8_ = 0;
  c._264_8_ = 0;
  c._248_8_ = 0;
  c._256_8_ = 0;
  c._144_8_ = 0;
  c._152_8_ = 0;
  c._160_8_ = 0;
  c._168_8_ = 0;
  c._vptr_Clipper = (_func_int **)&PTR_ExecuteInternal_00393af8;
  c._136_8_ = &PTR__Clipper_00393b40;
  c.m_Joins.super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  c.m_Joins.super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  c.m_Joins.super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  c.m_GhostJoins.super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  c.m_GhostJoins.super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  c.m_GhostJoins.super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  c.m_IntersectList.
  super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  c.m_IntersectList.
  super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  c.m_IntersectList.
  super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  c.m_Maxima.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node._M_size = 0;
  lVar3 = 0;
  c.m_ExecuteLocked = false;
  c._176_1_ = 0;
  c.m_ReverseOutput = false;
  c.m_StrictSimple = false;
  c._208_2_ = 0;
  uVar5 = 0;
  c.m_Maxima.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       c.m_Maxima.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
       super__List_node_base._M_next;
  while( true ) {
    pvVar1 = (paths->
             super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(paths->
                       super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18) <= uVar5)
    break;
    tmp.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tmp.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tmp.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar4 = (ulong)pathIsClosed;
    Minkowski(pattern,(Path *)((long)&(pvVar1->
                                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                      )._M_impl.super__Vector_impl_data + lVar3),&tmp,true,
              pathIsClosed);
    ClipperBase::AddPaths((ClipperBase *)(c._vptr_Clipper[-3] + (long)&c),&tmp,ptSubject,true);
    if (pathIsClosed) {
      tmp2.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      tmp2.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      tmp2.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pIVar2 = (pattern->
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
               _M_impl.super__Vector_impl_data._M_start;
      delta.Y = uVar4;
      delta.X = pIVar2->Y;
      TranslatePath((ClipperLib *)
                    ((long)&(((paths->
                              super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            )._M_impl.super__Vector_impl_data + lVar3),
                    (Path *)&tmp2.
                             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                    ,(Path *)pIVar2->X,delta);
      ClipperBase::AddPath
                ((ClipperBase *)(c._vptr_Clipper[-3] + (long)&c),
                 (Path *)&tmp2.
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                 ,ptClip,true);
      std::_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~_Vector_base
                (&tmp2.
                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>);
    }
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::~vector(&tmp);
    uVar5 = uVar5 + 1;
    lVar3 = lVar3 + 0x18;
  }
  Clipper::Execute(&c,ctUnion,solution,pftNonZero,pftNonZero);
  Clipper::~Clipper(&c);
  return;
}

Assistant:

void MinkowskiSum(const Path& pattern, const Paths& paths, Paths& solution, bool pathIsClosed)
{
  Clipper c;
  for (size_t i = 0; i < paths.size(); ++i)
  {
    Paths tmp;
    Minkowski(pattern, paths[i], tmp, true, pathIsClosed);
    c.AddPaths(tmp, ptSubject, true);
    if (pathIsClosed)
    {
      Path tmp2;
      TranslatePath(paths[i], tmp2, pattern[0]);
      c.AddPath(tmp2, ptClip, true);
    }
  }
    c.Execute(ctUnion, solution, pftNonZero, pftNonZero);
}